

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueFloatCase::test(UniformValueFloatCase *this)

{
  TestContext *pTVar1;
  char *pcVar2;
  bool bVar3;
  deUint32 dVar4;
  GLint GVar5;
  RenderContext *renderCtx;
  GLint location;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  UniformValueFloatCase *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  renderCtx = gles2::Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  pcVar2 = test::testVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar2,&local_1d1);
  pcVar2 = test::testFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,pcVar2,(allocator<char> *)((long)&location + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_208);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&location + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (bVar3) {
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,dVar4);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"floatUniform");
    glu::CallLogWrapper::glUniform1f(&(this->super_ApiCase).super_CallLogWrapper,GVar5,1.0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformValue1f(pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar5,1.0);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"float2Uniform");
    glu::CallLogWrapper::glUniform2f(&(this->super_ApiCase).super_CallLogWrapper,GVar5,1.0,2.0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformValue2f(pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar5,1.0,2.0);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"float3Uniform");
    glu::CallLogWrapper::glUniform3f(&(this->super_ApiCase).super_CallLogWrapper,GVar5,1.0,2.0,3.0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformValue3f(pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar5,1.0,2.0,3.0)
    ;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"float4Uniform");
    glu::CallLogWrapper::glUniform4f
              (&(this->super_ApiCase).super_CallLogWrapper,GVar5,1.0,2.0,3.0,4.0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformValue4f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar5,1.0,2.0,3.0,4.0);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  else {
    glu::operator<<((this->super_ApiCase).m_log,(ShaderProgram *)local_e0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp float floatUniform;\n"
			"uniform highp vec2 float2Uniform;\n"
			"uniform highp vec3 float3Uniform;\n"
			"uniform highp vec4 float4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(floatUniform + float2Uniform.x + float3Uniform.x + float4Uniform.x);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program.getProgram(), "floatUniform");
		glUniform1f(location, 1.0f);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), location, 1.0f);

		location = glGetUniformLocation(program.getProgram(), "float2Uniform");
		glUniform2f(location, 1.0f, 2.0f);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), location, 1.0f, 2.0f);

		location = glGetUniformLocation(program.getProgram(), "float3Uniform");
		glUniform3f(location, 1.0f, 2.0f, 3.0f);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), location, 1.0f, 2.0f, 3.0f);

		location = glGetUniformLocation(program.getProgram(), "float4Uniform");
		glUniform4f(location, 1.0f, 2.0f, 3.0f, 4.0f);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), location, 1.0f, 2.0f, 3.0f, 4.0f);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}